

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_OverrideKeyMethodWithKey_Test::TestBody
          (SSLTest_OverrideKeyMethodWithKey_Test *this)

{
  int iVar1;
  SSL_METHOD *meth;
  char *in_R9;
  char *expected_predicate_value;
  pointer *__ptr;
  UniquePtr<SSL> client;
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<SSL> server;
  UniquePtr<X509> leaf;
  UniquePtr<EVP_PKEY> key;
  _Head_base<0UL,_ssl_st_*,_false> local_b0;
  internal local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_98;
  _Head_base<0UL,_ssl_st_*,_false> local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  char local_28 [8];
  AssertHelper local_20;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  
  KeyFromPEM((anon_unknown_0 *)&local_18,(anonymous_namespace)::GetTestKey()::kKeyPEM);
  local_a8[0] = (internal)((EVP_PKEY *)local_18._M_head_impl != (EVP_PKEY *)0x0);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_18._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,local_a8,(AssertionResult *)0x3a8821,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x136a,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
    }
    if ((X509 *)local_88._M_head_impl != (X509 *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    goto LAB_0019849f;
  }
  CertFromPEM((anon_unknown_0 *)&local_88,
              "-----BEGIN CERTIFICATE-----\nMIICWDCCAcGgAwIBAgIJAPuwTC6rEJsMMA0GCSqGSIb3DQEBBQUAMEUxCzAJBgNV\nBAYTAkFVMRMwEQYDVQQIDApTb21lLVN0YXRlMSEwHwYDVQQKDBhJbnRlcm5ldCBX\naWRnaXRzIFB0eSBMdGQwHhcNMTQwNDIzMjA1MDQwWhcNMTcwNDIyMjA1MDQwWjBF\nMQswCQYDVQQGEwJBVTETMBEGA1UECAwKU29tZS1TdGF0ZTEhMB8GA1UECgwYSW50\nZXJuZXQgV2lkZ2l0cyBQdHkgTHRkMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCBiQKB\ngQDYK8imMuRi/03z0K1Zi0WnvfFHvwlYeyK9Na6XJYaUoIDAtB92kWdGMdAQhLci\nHnAjkXLI6W15OoV3gA/ElRZ1xUpxTMhjP6PyY5wqT5r6y8FxbiiFKKAnHmUcrgfV\nW28tQ+0rkLGMryRtrukXOgXBv7gcrmU7G1jC2a7WqmeI8QIDAQABo1AwTjAdBgNV\nHQ4EFgQUi3XVrMsIvg4fZbf6Vr5sp3Xaha8wHwYDVR0jBBgwFoAUi3XVrMsIvg4f\nZbf6Vr5sp3Xaha8wDAYDVR0TBAUwAwEB/zANBgkqhkiG9w0BAQUFAAOBgQA76Hht\nldY9avcTGSwbwoiuIqv0jTL1fHFnzy3RHMLDh+Lpvolc5DSrSJHCP5WuK0eeJXhr\nT5oQpHL9z/cCDLAKCKRa4uV0fhEdOWBqyR9p8y5jJtye72t6CuFUV5iqcpF4BH4f\nj2VNHwsSrJwkD4QUGlUtH7vwnQmyCFxZMmWAJg==\n-----END CERTIFICATE-----\n"
             );
  local_a8[0] = (internal)((X509 *)local_88._M_head_impl != (X509 *)0x0);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_88._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,local_a8,(AssertionResult *)"leaf","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x136c,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
    }
    if (local_98._M_head_impl != (SSL_CTX *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  else {
    meth = (SSL_METHOD *)TLS_method();
    local_98._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
    local_a8[0] = (internal)(local_98._M_head_impl != (SSL_CTX *)0x0);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_98._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,local_a8,(AssertionResult *)0x3442d9,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x136f,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
LAB_00198444:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)local_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
      }
      if (local_b0._M_head_impl != (SSL *)0x0) {
        (*(local_b0._M_head_impl)->method->ssl_new)(local_b0._M_head_impl);
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
    }
    else {
      iVar1 = SSL_CTX_use_certificate
                        ((SSL_CTX *)local_98._M_head_impl,(X509 *)local_88._M_head_impl);
      local_a8[0] = (internal)(iVar1 != 0);
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,local_a8,
                   (AssertionResult *)"SSL_CTX_use_certificate(ctx.get(), leaf.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1370,(char *)local_78._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
        goto LAB_00198444;
      }
      SSL_CTX_set_private_key_method(local_98._M_head_impl,&TestBody::kErrorMethod);
      iVar1 = SSL_CTX_use_PrivateKey
                        ((SSL_CTX *)local_98._M_head_impl,(EVP_PKEY *)local_18._M_head_impl);
      local_a8[0] = (internal)(iVar1 != 0);
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,local_a8,
                   (AssertionResult *)"SSL_CTX_use_PrivateKey(ctx.get(), key.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1375,(char *)local_78._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
        goto LAB_00198444;
      }
      local_b0._M_head_impl = (SSL *)0x0;
      local_90._M_head_impl = (ssl_st *)0x0;
      local_68._24_8_ = 0;
      local_38._8_8_ = 0;
      local_78._0_8_ = (SSL_SESSION *)0x0;
      local_78._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
      local_68._8_8_ = 0;
      local_68._16_8_ = 0;
      sStack_40 = 0;
      local_38._M_allocated_capacity = 0;
      local_28[0] = '\0';
      local_28[1] = '\0';
      local_28[2] = '\0';
      local_28[3] = '\0';
      local_28[4] = '\0';
      local_28[5] = '\0';
      local_28[6] = '\0';
      local_28[7] = '\0';
      expected_predicate_value = (char *)0x1;
      local_68._0_8_ = local_68 + 0x10;
      local_48._M_p = (pointer)&local_38;
      local_a8[0] = (internal)
                    ConnectClientAndServer
                              ((UniquePtr<SSL> *)&local_b0,(UniquePtr<SSL> *)&local_90,
                               local_98._M_head_impl,local_98._M_head_impl,(ClientConfig *)local_78,
                               true);
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_p != &local_38) {
        operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,local_a8,
                   (AssertionResult *)
                   "ConnectClientAndServer(&client, &server, ctx.get(), ctx.get())","false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1378,(char *)local_78._0_8_);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)local_68) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
        }
        if (local_80._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_80._M_head_impl + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_90);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_b0);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_98);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_88);
LAB_0019849f:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> GetTestKey() {
  static const char kKeyPEM[] =
      "-----BEGIN RSA PRIVATE KEY-----\n"
      "MIICXgIBAAKBgQDYK8imMuRi/03z0K1Zi0WnvfFHvwlYeyK9Na6XJYaUoIDAtB92\n"
      "kWdGMdAQhLciHnAjkXLI6W15OoV3gA/ElRZ1xUpxTMhjP6PyY5wqT5r6y8FxbiiF\n"
      "KKAnHmUcrgfVW28tQ+0rkLGMryRtrukXOgXBv7gcrmU7G1jC2a7WqmeI8QIDAQAB\n"
      "AoGBAIBy09Fd4DOq/Ijp8HeKuCMKTHqTW1xGHshLQ6jwVV2vWZIn9aIgmDsvkjCe\n"
      "i6ssZvnbjVcwzSoByhjN8ZCf/i15HECWDFFh6gt0P5z0MnChwzZmvatV/FXCT0j+\n"
      "WmGNB/gkehKjGXLLcjTb6dRYVJSCZhVuOLLcbWIV10gggJQBAkEA8S8sGe4ezyyZ\n"
      "m4e9r95g6s43kPqtj5rewTsUxt+2n4eVodD+ZUlCULWVNAFLkYRTBCASlSrm9Xhj\n"
      "QpmWAHJUkQJBAOVzQdFUaewLtdOJoPCtpYoY1zd22eae8TQEmpGOR11L6kbxLQsk\n"
      "aMly/DOnOaa82tqAGTdqDEZgSNmCeKKknmECQAvpnY8GUOVAubGR6c+W90iBuQLj\n"
      "LtFp/9ihd2w/PoDwrHZaoUYVcT4VSfJQog/k7kjE4MYXYWL8eEKg3WTWQNECQQDk\n"
      "104Wi91Umd1PzF0ijd2jXOERJU1wEKe6XLkYYNHWQAe5l4J4MWj9OdxFXAxIuuR/\n"
      "tfDwbqkta4xcux67//khAkEAvvRXLHTaa6VFzTaiiO8SaFsHV3lQyXOtMrBpB5jd\n"
      "moZWgjHvB2W9Ckn7sDqsPB+U2tyX0joDdQEyuiMECDY8oQ==\n"
      "-----END RSA PRIVATE KEY-----\n";
  return KeyFromPEM(kKeyPEM);
}